

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

bool ImGui::ImageButton(Texture *texture,Vector2f *size,int framePadding,Color *bgColor,
                       Color *tintColor)

{
  int frame_padding;
  bool bVar1;
  uint glTextureHandle;
  ImTextureID user_texture_id;
  ImVec4 local_94;
  ImVec4 local_84;
  Color local_74;
  ImVec4 local_70;
  ImVec4 local_60;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImTextureID local_38;
  ImTextureID textureID;
  Color *tintColor_local;
  Color *bgColor_local;
  Vector2f *pVStack_18;
  int framePadding_local;
  Vector2f *size_local;
  Texture *texture_local;
  
  textureID = tintColor;
  tintColor_local = bgColor;
  bgColor_local._4_4_ = framePadding;
  pVStack_18 = size;
  size_local = (Vector2f *)texture;
  glTextureHandle = sf::Texture::getNativeHandle(texture);
  user_texture_id = anon_unknown.dwarf_f6bf2::convertGLTextureHandleToImTextureID(glTextureHandle);
  local_38 = user_texture_id;
  ImVec2::ImVec2(&local_40,pVStack_18->x,pVStack_18->y);
  ImVec2::ImVec2(&local_48,0.0,0.0);
  ImVec2::ImVec2(&local_50,1.0,1.0);
  frame_padding = bgColor_local._4_4_;
  local_74 = *tintColor_local;
  local_70 = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(local_74);
  local_60 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_70);
  local_94 = (ImVec4)anon_unknown.dwarf_f6bf2::toImColor(*textureID);
  local_84 = ImColor::operator_cast_to_ImVec4((ImColor *)&local_94);
  bVar1 = ImageButton(user_texture_id,&local_40,&local_48,&local_50,frame_padding,&local_60,
                      &local_84);
  return bVar1;
}

Assistant:

bool ImageButton(const sf::Texture& texture, const sf::Vector2f& size, const int framePadding,
                 const sf::Color& bgColor, const sf::Color& tintColor) {
    ImTextureID textureID = convertGLTextureHandleToImTextureID(texture.getNativeHandle());

    return ImGui::ImageButton(textureID, ImVec2(size.x, size.y), ImVec2(0, 0), ImVec2(1, 1),
                              framePadding, toImColor(bgColor), toImColor(tintColor));
}